

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

ssize_t sf_parse_params(uint8_t *begin,uint8_t *end)

{
  uint8_t uVar1;
  byte *pbVar2;
  ssize_t sVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  
  puVar4 = begin;
  puVar9 = begin;
  if (begin != end) {
    do {
      puVar4 = puVar9;
      if (*puVar9 != ';') break;
      lVar6 = 0;
      do {
        lVar5 = lVar6;
        if (puVar9 + lVar5 + 1 == end) {
          return -1;
        }
        uVar1 = puVar9[lVar5 + 1];
        lVar6 = lVar5 + 1;
      } while (uVar1 == ' ');
      pbVar7 = (byte *)0xffffffffffffffff;
      if (uVar1 == '*' || (byte)(uVar1 + 0x9f) < 0x1a) {
        pbVar8 = puVar9 + lVar6;
        pbVar2 = pbVar8 + (long)(end + (-lVar6 - (long)puVar9));
        do {
          pbVar7 = pbVar8;
          if (SF_KEY_CHARS[*pbVar8] == 0) break;
          pbVar8 = pbVar8 + 1;
          pbVar7 = pbVar2;
        } while (pbVar8 != end);
        pbVar7 = pbVar7 + (-lVar6 - (long)puVar9);
      }
      if ((long)pbVar7 < 0) {
        return -1;
      }
      puVar4 = puVar9 + (long)(pbVar7 + lVar6);
      if ((puVar4 != end) && (puVar9[(long)(pbVar7 + lVar6)] == '=')) {
        if (puVar9 + (long)(pbVar7 + lVar5 + 2) == end) {
          return -1;
        }
        sVar3 = sf_parse_bare_item((nghttp2_sf_value *)0x0,puVar9 + (long)(pbVar7 + lVar5 + 2),end);
        if (sVar3 < 0) {
          return -1;
        }
        puVar4 = puVar9 + (long)(pbVar7 + lVar6 + sVar3 + 1);
      }
      puVar9 = puVar4;
    } while (puVar4 != end);
  }
  return (long)puVar4 - (long)begin;
}

Assistant:

static ssize_t sf_parse_params(const uint8_t *begin, const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  for (; p != end && *p == ';';) {
    ++p;

    sf_discard_sp_end_err(p, end, -1);

    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
    } else if (++p == end) {
      return -1;
    } else {
      slen = sf_parse_bare_item(NULL, p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;
    }
  }

  return p - begin;
}